

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O1

array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> * __thiscall
polyscope::CameraParameters::generateCameraRayCorners
          (array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *__return_storage_ptr__,
          CameraParameters *this)

{
  int iVar1;
  long lVar2;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined8 uVar8;
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vec3 vVar13;
  vec<3,_float,_(glm::qualifier)0> vVar14;
  vec3 screenPos3;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4x4 viewMat;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_110;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_10c;
  float local_108;
  undefined4 local_104;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *local_100;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  vec<4,_float,_(glm::qualifier)0> local_c8;
  mat<4,_4,_float,_(glm::qualifier)0> local_b8;
  mat<4,_4,_float,_(glm::qualifier)0> local_78;
  
  local_78.value[0].field_0 = (this->extrinsics).E.value[0].field_0;
  local_78.value[0].field_1 = (this->extrinsics).E.value[0].field_1;
  local_78.value[0].field_2 = (this->extrinsics).E.value[0].field_2;
  local_78.value[0].field_3 = (this->extrinsics).E.value[0].field_3;
  local_78.value[1].field_0 = (this->extrinsics).E.value[1].field_0;
  local_78.value[1].field_1 = (this->extrinsics).E.value[1].field_1;
  local_78.value[1].field_2 = (this->extrinsics).E.value[1].field_2;
  local_78.value[1].field_3 = (this->extrinsics).E.value[1].field_3;
  local_78.value[2].field_0 = (this->extrinsics).E.value[2].field_0;
  local_78.value[2].field_1 = (this->extrinsics).E.value[2].field_1;
  local_78.value[2].field_2 = (this->extrinsics).E.value[2].field_2;
  local_78.value[2].field_3 = (this->extrinsics).E.value[2].field_3;
  local_78.value[3].field_0 = (this->extrinsics).E.value[3].field_0;
  local_78.value[3].field_1 = (this->extrinsics).E.value[3].field_1;
  local_78.value[3].field_2 = (this->extrinsics).E.value[3].field_2;
  local_78.value[3].field_3 = (this->extrinsics).E.value[3].field_3;
  fVar5 = (this->intrinsics).aspectRatioWidthOverHeight;
  fVar4 = tanf((this->intrinsics).fovVerticalDegrees * 0.017453292 * 0.5);
  fVar5 = fVar4 * fVar5;
  local_b8.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_b8.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_b8.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_b8.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_b8.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_b8.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_b8.value[0].field_1.y = 0.0;
  local_b8.value[0].field_0.x = 2.0 / (fVar5 + fVar5);
  auVar10._8_4_ = 0xbf800000;
  auVar10._0_8_ = 0xbf800000bf800000;
  auVar10._12_4_ = 0xbf800000;
  local_b8.value[1]._0_8_ = (ulong)(uint)(2.0 / (fVar4 + fVar4)) << 0x20;
  local_b8.value[2]._8_8_ = vmovlps_avx(auVar10);
  local_b8.value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0xc0000000;
  local_b8.value[3].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  uVar8 = 0x3f8000003f800000;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  local_c8.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  vVar13 = CameraExtrinsics::getPosition(&this->extrinsics);
  local_f8 = &__return_storage_ptr__->_M_elems[0].field_2;
  local_f0 = 0;
  iVar1 = 0;
  local_100 = __return_storage_ptr__;
  uStack_d0 = uVar8;
  do {
    paVar3 = local_f8 + local_f0 * 3;
    lVar2 = 0;
    do {
      local_110 = vVar13.field_2;
      local_d8 = vVar13._0_8_;
      local_10c.x = (float)(int)lVar2;
      auVar9 = (undefined1  [56])0x0;
      local_104 = 0;
      local_108 = 1.0 - (float)iVar1;
      vVar14 = glm::unProjectNO<float,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_10c,&local_78,&local_b8,
                          &local_c8);
      auVar7._0_8_ = vVar14._0_8_;
      auVar7._8_56_ = auVar9;
      fVar4 = vVar14.field_2.z - local_110.z;
      auVar12._8_8_ = uStack_d0;
      auVar12._0_8_ = local_d8;
      auVar12 = vsubps_avx(auVar7._0_16_,auVar12);
      auVar6._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar6._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar6._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar6._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      auVar10 = vhaddps_avx(auVar6,auVar6);
      fVar5 = fVar4 * fVar4 + auVar10._0_4_;
      if (fVar5 < 0.0) {
        local_e8 = auVar12;
        fVar5 = sqrtf(fVar5);
        auVar12 = local_e8;
      }
      else {
        auVar10 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
        fVar5 = auVar10._0_4_;
      }
      vVar13.field_2.z = local_110.z;
      vVar13.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_d8;
      vVar13.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_d8._4_4_;
      fVar5 = 1.0 / fVar5;
      auVar11._0_4_ = fVar5 * auVar12._0_4_;
      auVar11._4_4_ = fVar5 * auVar12._4_4_;
      auVar11._8_4_ = fVar5 * auVar12._8_4_;
      auVar11._12_4_ = fVar5 * auVar12._12_4_;
      uVar8 = vmovlps_avx(auVar11);
      ((vec<3,_float,_(glm::qualifier)0> *)(paVar3 + -2))->field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar8;
      ((vec<3,_float,_(glm::qualifier)0> *)(paVar3 + -2))->field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar8 >> 0x20);
      paVar3->z = fVar5 * fVar4;
      lVar2 = lVar2 + 1;
      paVar3 = paVar3 + 3;
    } while ((int)lVar2 != 2);
    iVar1 = iVar1 + 1;
    local_f0 = local_f0 + lVar2;
  } while (iVar1 != 2);
  return local_100;
}

Assistant:

std::array<glm::vec3, 4> CameraParameters::generateCameraRayCorners() const {

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., 1., 1.};
  glm::vec3 rootPos = getPosition();

  std::array<glm::vec3, 4> outCorners;

  size_t i = 0;
  for (float iY = 0; iY <= 1.; iY++) {
    for (float iX = 0; iX <= 1.; iX++) {
      glm::vec3 screenPos3 = glm::vec3{iX, 1. - iY, 0.};
      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);
      outCorners[i] = worldRayDir;
      i++;
    }
  }

  return outCorners;
}